

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O0

void __thiscall RVO::RVOSimulator::removeObstacle(RVOSimulator *this,size_t obstacleNo)

{
  value_type pOVar1;
  reference ppOVar2;
  size_t obstacleNo_local;
  RVOSimulator *this_local;
  
  ppOVar2 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::operator[]
                      (&this->obstacles_,obstacleNo);
  if (*ppOVar2 != (value_type)0x0) {
    operator_delete(*ppOVar2,0x10);
  }
  ppOVar2 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::back(&this->obstacles_);
  pOVar1 = *ppOVar2;
  ppOVar2 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::operator[]
                      (&this->obstacles_,obstacleNo);
  *ppOVar2 = pOVar1;
  std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::pop_back(&this->obstacles_);
  return;
}

Assistant:

void RVOSimulator::removeObstacle(size_t obstacleNo)
	{
		delete obstacles_[obstacleNo];
		obstacles_[obstacleNo] = obstacles_.back();
		obstacles_.pop_back();
	}